

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int yaml_parser_scan_tag(yaml_parser_t *parser,yaml_token_t *token)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  undefined8 uVar4;
  yaml_mark_t start_mark_00;
  yaml_mark_t context_mark;
  yaml_mark_t start_mark_01;
  yaml_mark_t start_mark_02;
  yaml_mark_t start_mark_03;
  yaml_mark_t context_mark_00;
  int iVar5;
  size_t sVar6;
  yaml_char_t *pyVar7;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  yaml_char_t *tmp;
  yaml_mark_t end_mark;
  yaml_mark_t start_mark;
  yaml_char_t *suffix;
  yaml_char_t *handle;
  yaml_token_t *token_local;
  yaml_parser_t *parser_local;
  
  suffix = (yaml_char_t *)0x0;
  start_mark.column = 0;
  sVar1 = (parser->mark).index;
  start_mark.index = (parser->mark).line;
  start_mark.line = (parser->mark).column;
  handle = (yaml_char_t *)token;
  token_local = (yaml_token_t *)parser;
  if ((parser->unread < 2) && (iVar5 = yaml_parser_update_buffer(parser,2), iVar5 == 0))
  goto LAB_001b73c4;
  if (*(char *)(token_local[1].end_mark.column + 1) == '<') {
    suffix = (yaml_char_t *)yaml_malloc(1);
    if (suffix == (yaml_char_t *)0x0) goto LAB_001b73c4;
    *suffix = '\0';
    token_local[2].end_mark.line = token_local[2].end_mark.line + 1;
    *(long *)(token_local + 3) = *(long *)(token_local + 3) + 1;
    token_local[2].data.tag.handle = token_local[2].data.tag.handle + -1;
    if ((*(byte *)token_local[1].end_mark.column & 0x80) == 0) {
      local_6c = 1;
    }
    else {
      if ((*(byte *)token_local[1].end_mark.column & 0xe0) == 0xc0) {
        local_70 = 2;
      }
      else {
        if ((*(byte *)token_local[1].end_mark.column & 0xf0) == 0xe0) {
          local_74 = 3;
        }
        else {
          local_74 = 0;
          if ((*(byte *)token_local[1].end_mark.column & 0xf8) == 0xf0) {
            local_74 = 4;
          }
        }
        local_70 = local_74;
      }
      local_6c = local_70;
    }
    token_local[1].end_mark.column = token_local[1].end_mark.column + (long)local_6c;
    token_local[2].end_mark.line = token_local[2].end_mark.line + 1;
    *(long *)(token_local + 3) = *(long *)(token_local + 3) + 1;
    token_local[2].data.tag.handle = token_local[2].data.tag.handle + -1;
    if ((*(byte *)token_local[1].end_mark.column & 0x80) == 0) {
      local_78 = 1;
    }
    else {
      if ((*(byte *)token_local[1].end_mark.column & 0xe0) == 0xc0) {
        local_7c = 2;
      }
      else {
        if ((*(byte *)token_local[1].end_mark.column & 0xf0) == 0xe0) {
          local_80 = 3;
        }
        else {
          local_80 = 0;
          if ((*(byte *)token_local[1].end_mark.column & 0xf8) == 0xf0) {
            local_80 = 4;
          }
        }
        local_7c = local_80;
      }
      local_78 = local_7c;
    }
    token_local[1].end_mark.column = token_local[1].end_mark.column + (long)local_78;
    start_mark_00.line = start_mark.index;
    start_mark_00.index = sVar1;
    start_mark_00.column = start_mark.line;
    iVar5 = yaml_parser_scan_tag_uri
                      ((yaml_parser_t *)token_local,0,(yaml_char_t *)0x0,start_mark_00,
                       (yaml_char_t **)&start_mark.column);
    if (iVar5 == 0) goto LAB_001b73c4;
    if (*(char *)token_local[1].end_mark.column != '>') {
      context_mark.line = start_mark.index;
      context_mark.index = sVar1;
      context_mark.column = start_mark.line;
      yaml_parser_set_scanner_error
                ((yaml_parser_t *)token_local,"while scanning a tag",context_mark,
                 "did not find the expected \'>\'");
      goto LAB_001b73c4;
    }
    token_local[2].end_mark.line = token_local[2].end_mark.line + 1;
    *(long *)(token_local + 3) = *(long *)(token_local + 3) + 1;
    token_local[2].data.tag.handle = token_local[2].data.tag.handle + -1;
    if ((*(byte *)token_local[1].end_mark.column & 0x80) == 0) {
      local_84 = 1;
    }
    else {
      if ((*(byte *)token_local[1].end_mark.column & 0xe0) == 0xc0) {
        local_88 = 2;
      }
      else {
        if ((*(byte *)token_local[1].end_mark.column & 0xf0) == 0xe0) {
          local_8c = 3;
        }
        else {
          local_8c = 0;
          if ((*(byte *)token_local[1].end_mark.column & 0xf8) == 0xf0) {
            local_8c = 4;
          }
        }
        local_88 = local_8c;
      }
      local_84 = local_88;
    }
    token_local[1].end_mark.column = token_local[1].end_mark.column + (long)local_84;
  }
  else {
    start_mark_01.line = start_mark.index;
    start_mark_01.index = sVar1;
    start_mark_01.column = start_mark.line;
    iVar5 = yaml_parser_scan_tag_handle((yaml_parser_t *)token_local,0,start_mark_01,&suffix);
    pyVar7 = suffix;
    if (iVar5 == 0) goto LAB_001b73c4;
    if (((*suffix == '!') && (suffix[1] != '\0')) &&
       (sVar6 = strlen((char *)suffix), pyVar7[sVar6 - 1] == '!')) {
      start_mark_02.line = start_mark.index;
      start_mark_02.index = sVar1;
      start_mark_02.column = start_mark.line;
      iVar5 = yaml_parser_scan_tag_uri
                        ((yaml_parser_t *)token_local,0,(yaml_char_t *)0x0,start_mark_02,
                         (yaml_char_t **)&start_mark.column);
      if (iVar5 == 0) goto LAB_001b73c4;
    }
    else {
      start_mark_03.line = start_mark.index;
      start_mark_03.index = sVar1;
      start_mark_03.column = start_mark.line;
      iVar5 = yaml_parser_scan_tag_uri
                        ((yaml_parser_t *)token_local,0,suffix,start_mark_03,
                         (yaml_char_t **)&start_mark.column);
      if (iVar5 == 0) goto LAB_001b73c4;
      yaml_free(suffix);
      pyVar7 = (yaml_char_t *)yaml_malloc(2);
      suffix = pyVar7;
      if (pyVar7 == (yaml_char_t *)0x0) goto LAB_001b73c4;
      *pyVar7 = '!';
      pyVar7[1] = '\0';
      if (*(char *)start_mark.column == '\0') {
        suffix = (yaml_char_t *)start_mark.column;
        start_mark.column = (size_t)pyVar7;
      }
    }
  }
  if ((token_local[2].data.tag.handle != (yaml_char_t *)0x0) ||
     (iVar5 = yaml_parser_update_buffer((yaml_parser_t *)token_local,1), iVar5 != 0)) {
    if ((((*(char *)token_local[1].end_mark.column == ' ') ||
         ((*(char *)token_local[1].end_mark.column == '\t' ||
          (*(char *)token_local[1].end_mark.column == '\r')))) ||
        (*(char *)token_local[1].end_mark.column == '\n')) ||
       (((((*(char *)token_local[1].end_mark.column == -0x3e &&
           (*(char *)(token_local[1].end_mark.column + 1) == -0x7b)) ||
          ((*(char *)token_local[1].end_mark.column == -0x1e &&
           ((*(char *)(token_local[1].end_mark.column + 1) == -0x80 &&
            (*(char *)(token_local[1].end_mark.column + 2) == -0x58)))))) ||
         ((*(char *)token_local[1].end_mark.column == -0x1e &&
          ((*(char *)(token_local[1].end_mark.column + 1) == -0x80 &&
           (*(char *)(token_local[1].end_mark.column + 2) == -0x57)))))) ||
        (*(char *)token_local[1].end_mark.column == '\0')))) {
      sVar2 = token_local[2].end_mark.line;
      sVar3 = token_local[2].end_mark.column;
      uVar4 = *(undefined8 *)(token_local + 3);
      memset(handle,0,0x50);
      handle[0] = '\x14';
      handle[1] = '\0';
      handle[2] = '\0';
      handle[3] = '\0';
      *(size_t *)(handle + 0x20) = sVar1;
      *(size_t *)(handle + 0x28) = start_mark.index;
      *(size_t *)(handle + 0x30) = start_mark.line;
      *(size_t *)(handle + 0x38) = sVar2;
      *(size_t *)(handle + 0x40) = sVar3;
      *(undefined8 *)(handle + 0x48) = uVar4;
      *(yaml_char_t **)(handle + 8) = suffix;
      *(size_t *)(handle + 0x10) = start_mark.column;
      return 1;
    }
    context_mark_00.line = start_mark.index;
    context_mark_00.index = sVar1;
    context_mark_00.column = start_mark.line;
    yaml_parser_set_scanner_error
              ((yaml_parser_t *)token_local,"while scanning a tag",context_mark_00,
               "did not find expected whitespace or line break");
  }
LAB_001b73c4:
  yaml_free(suffix);
  yaml_free((void *)start_mark.column);
  return 0;
}

Assistant:

static int
yaml_parser_scan_tag(yaml_parser_t *parser, yaml_token_t *token)
{
    yaml_char_t *handle = NULL;
    yaml_char_t *suffix = NULL;
    yaml_mark_t start_mark, end_mark;

    start_mark = parser->mark;

    /* Check if the tag is in the canonical form. */

    if (!CACHE(parser, 2)) goto error;

    if (CHECK_AT(parser->buffer, '<', 1))
    {
        /* Set the handle to '' */

        handle = yaml_malloc(1);
        if (!handle) goto error;
        handle[0] = '\0';

        /* Eat '!<' */

        SKIP(parser);
        SKIP(parser);

        /* Consume the tag value. */

        if (!yaml_parser_scan_tag_uri(parser, 0, NULL, start_mark, &suffix))
            goto error;

        /* Check for '>' and eat it. */

        if (!CHECK(parser->buffer, '>')) {
            yaml_parser_set_scanner_error(parser, "while scanning a tag",
                    start_mark, "did not find the expected '>'");
            goto error;
        }

        SKIP(parser);
    }
    else
    {
        /* The tag has either the '!suffix' or the '!handle!suffix' form. */

        /* First, try to scan a handle. */

        if (!yaml_parser_scan_tag_handle(parser, 0, start_mark, &handle))
            goto error;

        /* Check if it is, indeed, handle. */

        if (handle[0] == '!' && handle[1] != '\0' && handle[strlen((char *)handle)-1] == '!')
        {
            /* Scan the suffix now. */

            if (!yaml_parser_scan_tag_uri(parser, 0, NULL, start_mark, &suffix))
                goto error;
        }
        else
        {
            /* It wasn't a handle after all.  Scan the rest of the tag. */

            if (!yaml_parser_scan_tag_uri(parser, 0, handle, start_mark, &suffix))
                goto error;

            /* Set the handle to '!'. */

            yaml_free(handle);
            handle = yaml_malloc(2);
            if (!handle) goto error;
            handle[0] = '!';
            handle[1] = '\0';

            /*
             * A special case: the '!' tag.  Set the handle to '' and the
             * suffix to '!'.
             */

            if (suffix[0] == '\0') {
                yaml_char_t *tmp = handle;
                handle = suffix;
                suffix = tmp;
            }
        }
    }

    /* Check the character which ends the tag. */

    if (!CACHE(parser, 1)) goto error;

    if (!IS_BLANKZ(parser->buffer)) {
        yaml_parser_set_scanner_error(parser, "while scanning a tag",
                start_mark, "did not find expected whitespace or line break");
        goto error;
    }

    end_mark = parser->mark;

    /* Create a token. */

    TAG_TOKEN_INIT(*token, handle, suffix, start_mark, end_mark);

    return 1;

error:
    yaml_free(handle);
    yaml_free(suffix);
    return 0;
}